

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobject.cpp
# Opt level: O2

void __thiscall
CorUnix::CSharedMemoryObject::PromoteSharedData
          (CSharedMemoryObject *this,SHMPTR shmObjData,SHMObjData *psmod)

{
  LPVOID pvVar1;
  CObjectType *pCVar2;
  
  if (shmObjData == 0) {
    fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x1d3);
    fprintf(_stderr,"Expression: SHMNULL != shmObjData\n");
  }
  if (psmod == (SHMObjData *)0x0) {
    fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
            ,0x1d4);
    fprintf(_stderr,"Expression: NULL != psmod\n");
  }
  if (PAL_InitializeChakraCoreCalled != false) {
    psmod->lProcessRefCount = 1;
    pCVar2 = (this->super_CPalObjectBase).m_pot;
    psmod->eTypeId = pCVar2->m_eTypeId;
    if (pCVar2->m_dwImmutableDataSize != 0) {
      pvVar1 = SHMPtrToPtr(psmod->shmObjImmutableData);
      if (pvVar1 == (LPVOID)0x0) {
        fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0x1ea);
        fprintf(_stderr,"Expression: NULL != pvImmutableData\n");
      }
      memcpy(pvVar1,(this->super_CPalObjectBase).m_pvImmutableData,
             (ulong)((this->super_CPalObjectBase).m_pot)->m_dwImmutableDataSize);
      pCVar2 = (this->super_CPalObjectBase).m_pot;
    }
    if (pCVar2->m_dwSharedDataSize != 0) {
      pvVar1 = SHMPtrToPtr(psmod->shmObjSharedData);
      if (pvVar1 == (LPVOID)0x0) {
        fprintf(_stderr,"] %s %s:%d","PromoteSharedData",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobject.cpp"
                ,0x1f8);
        fprintf(_stderr,"Expression: NULL != pvSharedData\n");
      }
      memcpy(pvVar1,this->m_pvSharedData,
             (ulong)((this->super_CPalObjectBase).m_pot)->m_dwSharedDataSize);
      InternalFree(this->m_pvSharedData);
      this->m_pvSharedData = pvVar1;
    }
    this->m_shmod = shmObjData;
    if (PAL_InitializeChakraCoreCalled != false) {
      return;
    }
  }
  abort();
}

Assistant:

void
CSharedMemoryObject::PromoteSharedData(
    SHMPTR shmObjData,
    SHMObjData *psmod
    )
{
    _ASSERTE(SHMNULL != shmObjData);
    _ASSERTE(NULL != psmod);
    
    ENTRY("CSharedMemoryObject::PromoteSharedData"
        "(this = %p, shmObjData = %p, psmod = %p)\n",
        this, 
        shmObjData,
        psmod);
    
    //
    // psmod has been zero-inited, so we don't need to worry about
    // shmPrevObj, shmNextObj, fAddedToList, shmObjName, dwNameLength,
    // or pvSynchData
    //
    
    psmod->lProcessRefCount = 1;
    psmod->eTypeId = m_pot->GetId();
    
    if (0 != m_pot->GetImmutableDataSize())
    {
        void *pvImmutableData;

        pvImmutableData = SHMPTR_TO_TYPED_PTR(void, psmod->shmObjImmutableData);
        _ASSERTE(NULL != pvImmutableData);

        CopyMemory(
            pvImmutableData,
            m_pvImmutableData,
            m_pot->GetImmutableDataSize()
            );
    }

    if (0 != m_pot->GetSharedDataSize())
    {
        void *pvSharedData;

        pvSharedData = SHMPTR_TO_TYPED_PTR(void, psmod->shmObjSharedData);
        _ASSERTE(NULL != pvSharedData);

        CopyMemory(
            pvSharedData,
            m_pvSharedData,
            m_pot->GetSharedDataSize()
            );
        
        InternalFree(m_pvSharedData);
        m_pvSharedData = pvSharedData;
    }

    m_shmod = shmObjData;

    LOGEXIT("CSharedMemoryObject::PromoteSharedData\n");
}